

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O2

void __thiscall CUIRect::VSplitLeft(CUIRect *this,float Cut,CUIRect *pLeft,CUIRect *pRight)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  uVar3 = this->x;
  uVar4 = this->y;
  fVar1 = this->w;
  fVar2 = this->h;
  if (pLeft != (CUIRect *)0x0) {
    pLeft->x = (float)uVar3;
    pLeft->y = (float)uVar4;
    pLeft->w = Cut;
    pLeft->h = fVar2;
  }
  if (pRight != (CUIRect *)0x0) {
    pRight->x = (float)uVar3 + Cut;
    pRight->y = (float)uVar4;
    pRight->w = fVar1 - Cut;
    pRight->h = fVar2;
  }
  return;
}

Assistant:

void CUIRect::VSplitLeft(float Cut, CUIRect *pLeft, CUIRect *pRight) const
{
	CUIRect r = *this;

	if(pLeft)
	{
		pLeft->x = r.x;
		pLeft->y = r.y;
		pLeft->w = Cut;
		pLeft->h = r.h;
	}

	if(pRight)
	{
		pRight->x = r.x + Cut;
		pRight->y = r.y;
		pRight->w = r.w - Cut;
		pRight->h = r.h;
	}
}